

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCexSave(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pCex == (Abc_Cex_t *)0x0) {
      Abc_Print(-1,"Current CEX is not available..\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (pAbc->pCex2 != (Abc_Cex_t *)0x0) {
        free(pAbc->pCex2);
        pAbc->pCex2 = (Abc_Cex_t *)0x0;
      }
      pAVar2 = Abc_CexDup(pAbc->pCex,-1);
      pAbc->pCex2 = pAVar2;
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: cexsave [-h]\n");
    Abc_Print(-2,"\t        saves the current CEX into the internal storage\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandCexSave( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Current CEX is not available..\n" );
        return 1;
    }
    ABC_FREE( pAbc->pCex2 );
    pAbc->pCex2 = Abc_CexDup( pAbc->pCex, -1 );
    return 0;

usage:
    Abc_Print( -2, "usage: cexsave [-h]\n" );
    Abc_Print( -2, "\t        saves the current CEX into the internal storage\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}